

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psintrp.c
# Opt level: O3

void cf2_doFlex(CF2_Stack opStack,CF2_F16Dot16 *curX,CF2_F16Dot16 *curY,CF2_GlyphPath glyphPath,
               FT_Bool *readFromStack,FT_Bool doConditionalLastRead)

{
  FT_Bool FVar1;
  bool bVar2;
  CF2_F16Dot16 CVar3;
  int iVar4;
  int iVar5;
  CF2_F16Dot16 CVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  FT_UFast idx;
  CF2_F16Dot16 local_68 [2];
  int iStack_60;
  CF2_F16Dot16 local_5c [7];
  int local_40;
  CF2_F16Dot16 local_3c;
  int local_38;
  CF2_F16Dot16 local_34;
  
  local_68[0] = *curX;
  local_68[1] = *curY;
  FVar1 = readFromStack[9];
  lVar9 = 0;
  idx = 0;
  do {
    iVar8 = local_68[lVar9];
    (&iStack_60)[lVar9] = iVar8;
    if (readFromStack[lVar9] != '\0') {
      CVar3 = cf2_stack_getReal(opStack,idx);
      (&iStack_60)[lVar9] = CVar3 + iVar8;
      idx = idx + 1;
    }
    lVar9 = lVar9 + 1;
  } while (10 - (ulong)(FVar1 == '\0') != lVar9);
  if (FVar1 == '\0') {
    local_3c = *curY;
  }
  CVar3 = local_3c;
  if (doConditionalLastRead == '\0') {
    if (readFromStack[10] == '\0') {
      iVar8 = *curX;
    }
    else {
      CVar3 = cf2_stack_getReal(opStack,idx);
      iVar8 = CVar3 + local_40;
      idx = idx + 1;
    }
    CVar3 = local_3c;
    local_38 = iVar8;
    if (readFromStack[0xb] == '\0') {
      local_34 = *curY;
    }
    else {
      local_34 = cf2_stack_getReal(opStack,idx);
      local_34 = local_34 + CVar3;
    }
  }
  else {
    iVar4 = local_40 - *curX;
    iVar8 = -iVar4;
    if (0 < iVar4) {
      iVar8 = iVar4;
    }
    iVar5 = local_3c - *curY;
    iVar4 = -iVar5;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    CVar6 = cf2_stack_getReal(opStack,idx);
    if (iVar4 < iVar8) {
      iVar8 = CVar6 + local_40;
      local_38 = iVar8;
      local_34 = *curY;
    }
    else {
      iVar8 = *curX;
      local_38 = iVar8;
      local_34 = CVar6 + CVar3;
    }
  }
  CVar3 = local_34;
  lVar9 = 0;
  bVar2 = true;
  do {
    bVar7 = bVar2;
    cf2_glyphpath_curveTo
              (glyphPath,(&iStack_60)[lVar9],local_5c[lVar9],local_5c[lVar9 + 1],local_5c[lVar9 + 2]
               ,local_5c[lVar9 + 3],local_5c[lVar9 + 4]);
    lVar9 = 6;
    bVar2 = false;
  } while (bVar7);
  opStack->top = opStack->buffer;
  *curX = iVar8;
  *curY = CVar3;
  return;
}

Assistant:

static void
  cf2_doFlex( CF2_Stack       opStack,
              CF2_Fixed*      curX,
              CF2_Fixed*      curY,
              CF2_GlyphPath   glyphPath,
              const FT_Bool*  readFromStack,
              FT_Bool         doConditionalLastRead )
  {
    CF2_Fixed  vals[14];
    CF2_UInt   idx;
    FT_Bool    isHFlex;
    CF2_Int    top, i, j;


    vals[0] = *curX;
    vals[1] = *curY;
    idx     = 0;
    isHFlex = FT_BOOL( readFromStack[9] == FALSE );
    top     = isHFlex ? 9 : 10;

    for ( i = 0; i < top; i++ )
    {
      vals[i + 2] = vals[i];
      if ( readFromStack[i] )
        vals[i + 2] = ADD_INT32( vals[i + 2], cf2_stack_getReal( opStack,
                                                                 idx++ ) );
    }

    if ( isHFlex )
      vals[9 + 2] = *curY;

    if ( doConditionalLastRead )
    {
      FT_Bool    lastIsX = FT_BOOL(
                             cf2_fixedAbs( SUB_INT32( vals[10], *curX ) ) >
                             cf2_fixedAbs( SUB_INT32( vals[11], *curY ) ) );
      CF2_Fixed  lastVal = cf2_stack_getReal( opStack, idx );


      if ( lastIsX )
      {
        vals[12] = ADD_INT32( vals[10], lastVal );
        vals[13] = *curY;
      }
      else
      {
        vals[12] = *curX;
        vals[13] = ADD_INT32( vals[11], lastVal );
      }
    }
    else
    {
      if ( readFromStack[10] )
        vals[12] = ADD_INT32( vals[10],
                              cf2_stack_getReal( opStack, idx++ ) );
      else
        vals[12] = *curX;

      if ( readFromStack[11] )
        vals[13] = ADD_INT32( vals[11],
                              cf2_stack_getReal( opStack, idx ) );
      else
        vals[13] = *curY;
    }

    for ( j = 0; j < 2; j++ )
      cf2_glyphpath_curveTo( glyphPath, vals[j * 6 + 2],
                                        vals[j * 6 + 3],
                                        vals[j * 6 + 4],
                                        vals[j * 6 + 5],
                                        vals[j * 6 + 6],
                                        vals[j * 6 + 7] );

    cf2_stack_clear( opStack );

    *curX = vals[12];
    *curY = vals[13];
  }